

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetPropertyScoped<false,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,FrameDisplay *pDisplay,PropertyId propertyId,Var defaultInstance)

{
  bool bVar1;
  BOOL BVar2;
  ModuleID moduleID;
  ScriptContext *this;
  void *aValue;
  Var thisVar;
  DynamicObject *object_00;
  Var value;
  Var varNull;
  Var value_1;
  RecyclableObject *object;
  undefined1 local_90 [6];
  uint16 i;
  PropertyValueInfo info;
  uint16 length;
  ScriptContext *scriptContext;
  Var defaultInstance_local;
  PropertyId propertyId_local;
  FrameDisplay *pDisplay_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  info._62_2_ = FrameDisplay::GetLength(pDisplay);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_90);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_90,functionBody,inlineCache,inlineCacheIndex,true);
  object._6_2_ = 0;
  while( true ) {
    if ((ushort)info._62_2_ <= object._6_2_) {
      if (propertyId == 0x2d5) {
        thisVar = OP_LdNull(this);
        moduleID = FunctionBody::GetModuleID(functionBody);
        functionBody_local =
             (FunctionBody *)OP_GetThis(thisVar,moduleID,&this->super_ScriptContextInfo);
      }
      else {
        if (propertyId == 0x2d6) {
          JavascriptError::ThrowReferenceError(this,-0x7ff5ebe7,(PCWSTR)0x0);
        }
        object_00 = VarTo<Js::DynamicObject>(defaultInstance);
        functionBody_local =
             (FunctionBody *)
             PatchGetRootValue<false,Js::InlineCache>
                       (functionBody,inlineCache,inlineCacheIndex,object_00,propertyId);
        bVar1 = ScriptContext::IsUndeclBlockVar(this,functionBody_local);
        if (bVar1) {
          JavascriptError::ThrowReferenceError(this,-0x7ff5ec07,(PCWSTR)0x0);
        }
      }
      return functionBody_local;
    }
    aValue = FrameDisplay::GetItem(pDisplay,(uint)object._6_2_);
    value_1 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    bVar1 = CacheOperators::TryGetProperty<true,true,true,false,true,true,true,false,false,false>
                      (value_1,false,(RecyclableObject *)value_1,propertyId,&varNull,this,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_90);
    if (bVar1) {
      return varNull;
    }
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
    if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetPropertyScoped",propertyId,this,(RecyclableObject *)value_1);
    }
    BVar2 = GetProperty((RecyclableObject *)value_1,propertyId,&varNull,this,
                        (PropertyValueInfo *)local_90);
    if (BVar2 != 0) break;
    object._6_2_ = object._6_2_ + 1;
  }
  bVar1 = ScriptContext::IsUndeclBlockVar(this,varNull);
  if ((bVar1) && (propertyId != 0x2d5)) {
    JavascriptError::ThrowReferenceError(this,-0x7ff5ec07,(PCWSTR)0x0);
  }
  return varNull;
}

Assistant:

inline Var JavascriptOperators::PatchGetPropertyScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var defaultInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetPropertyScoped);
        // Get the property, using a scope stack rather than an individual instance.
        // Walk the stack until we find an instance that has the property.

        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        uint16 length = pDisplay->GetLength();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        for (uint16 i = 0; i < length; i++)
        {
            RecyclableObject* object = UnsafeVarTo<RecyclableObject>(pDisplay->GetItem(i));

            Var value;
            if (CacheOperators::TryGetProperty<true, true, true, false, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                    object, false, object, propertyId, &value, scriptContext, nullptr, &info))
            {
                return value;
            }

#if DBG_DUMP
            if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
            {
                CacheOperators::TraceCache(inlineCache, _u("PatchGetPropertyScoped"), propertyId, scriptContext, object);
            }
#endif
            if (JavascriptOperators::GetProperty(object, propertyId, &value, scriptContext, &info))
            {
                if (scriptContext->IsUndeclBlockVar(value) && propertyId != PropertyIds::_this)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
                return value;
            }
        }

        // There is no root decl for 'this', we should instead load the global 'this' value.
        if (propertyId == PropertyIds::_this)
        {
            Var varNull = OP_LdNull(scriptContext);
            return JavascriptOperators::OP_GetThis(varNull, functionBody->GetModuleID(), scriptContext);
        }
        else if (propertyId == PropertyIds::_super)
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_BadSuperReference);
        }

        // No one in the scope stack has the property, so get it from the default instance provided by the caller.
        Var value = JavascriptOperators::PatchGetRootValue<IsFromFullJit>(functionBody, inlineCache, inlineCacheIndex, VarTo<DynamicObject>(defaultInstance), propertyId);
        if (scriptContext->IsUndeclBlockVar(value))
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
        }
        return value;
        JIT_HELPER_END(Op_PatchGetPropertyScoped);
    }